

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O0

ze_result_t zeGetMemProcAddrTable(ze_api_version_t version,ze_mem_dditable_t *pDdiTable)

{
  ze_api_version_t *pzVar1;
  ze_result_t result;
  ze_mem_dditable_t *dditable;
  ze_mem_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  pzVar1 = validation_layer::context;
  if (pDdiTable == (ze_mem_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (((int)*validation_layer::context >> 0x10 == (int)version >> 0x10) &&
          ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
    *(ze_pfnMemAllocShared_t *)(validation_layer::context + 0xee) = pDdiTable->pfnAllocShared;
    pDdiTable->pfnAllocShared = validation_layer::zeMemAllocShared;
    *(ze_pfnMemAllocDevice_t *)(pzVar1 + 0xf0) = pDdiTable->pfnAllocDevice;
    pDdiTable->pfnAllocDevice = validation_layer::zeMemAllocDevice;
    *(ze_pfnMemAllocHost_t *)(pzVar1 + 0xf2) = pDdiTable->pfnAllocHost;
    pDdiTable->pfnAllocHost = validation_layer::zeMemAllocHost;
    *(ze_pfnMemFree_t *)(pzVar1 + 0xf4) = pDdiTable->pfnFree;
    pDdiTable->pfnFree = validation_layer::zeMemFree;
    *(ze_pfnMemGetAllocProperties_t *)(pzVar1 + 0xf6) = pDdiTable->pfnGetAllocProperties;
    pDdiTable->pfnGetAllocProperties = validation_layer::zeMemGetAllocProperties;
    *(ze_pfnMemGetAddressRange_t *)(pzVar1 + 0xf8) = pDdiTable->pfnGetAddressRange;
    pDdiTable->pfnGetAddressRange = validation_layer::zeMemGetAddressRange;
    *(ze_pfnMemGetIpcHandle_t *)(pzVar1 + 0xfa) = pDdiTable->pfnGetIpcHandle;
    pDdiTable->pfnGetIpcHandle = validation_layer::zeMemGetIpcHandle;
    *(ze_pfnMemOpenIpcHandle_t *)(pzVar1 + 0xfc) = pDdiTable->pfnOpenIpcHandle;
    pDdiTable->pfnOpenIpcHandle = validation_layer::zeMemOpenIpcHandle;
    *(ze_pfnMemCloseIpcHandle_t *)(pzVar1 + 0xfe) = pDdiTable->pfnCloseIpcHandle;
    pDdiTable->pfnCloseIpcHandle = validation_layer::zeMemCloseIpcHandle;
    *(ze_pfnMemFreeExt_t *)(pzVar1 + 0x100) = pDdiTable->pfnFreeExt;
    pDdiTable->pfnFreeExt = validation_layer::zeMemFreeExt;
    *(ze_pfnMemPutIpcHandle_t *)(pzVar1 + 0x102) = pDdiTable->pfnPutIpcHandle;
    pDdiTable->pfnPutIpcHandle = validation_layer::zeMemPutIpcHandle;
    *(ze_pfnMemGetPitchFor2dImage_t *)(pzVar1 + 0x104) = pDdiTable->pfnGetPitchFor2dImage;
    pDdiTable->pfnGetPitchFor2dImage = validation_layer::zeMemGetPitchFor2dImage;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetMemProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_mem_dditable_t* pDdiTable                    ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zeDdiTable.Mem;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnAllocShared                              = pDdiTable->pfnAllocShared;
    pDdiTable->pfnAllocShared                            = validation_layer::zeMemAllocShared;

    dditable.pfnAllocDevice                              = pDdiTable->pfnAllocDevice;
    pDdiTable->pfnAllocDevice                            = validation_layer::zeMemAllocDevice;

    dditable.pfnAllocHost                                = pDdiTable->pfnAllocHost;
    pDdiTable->pfnAllocHost                              = validation_layer::zeMemAllocHost;

    dditable.pfnFree                                     = pDdiTable->pfnFree;
    pDdiTable->pfnFree                                   = validation_layer::zeMemFree;

    dditable.pfnGetAllocProperties                       = pDdiTable->pfnGetAllocProperties;
    pDdiTable->pfnGetAllocProperties                     = validation_layer::zeMemGetAllocProperties;

    dditable.pfnGetAddressRange                          = pDdiTable->pfnGetAddressRange;
    pDdiTable->pfnGetAddressRange                        = validation_layer::zeMemGetAddressRange;

    dditable.pfnGetIpcHandle                             = pDdiTable->pfnGetIpcHandle;
    pDdiTable->pfnGetIpcHandle                           = validation_layer::zeMemGetIpcHandle;

    dditable.pfnOpenIpcHandle                            = pDdiTable->pfnOpenIpcHandle;
    pDdiTable->pfnOpenIpcHandle                          = validation_layer::zeMemOpenIpcHandle;

    dditable.pfnCloseIpcHandle                           = pDdiTable->pfnCloseIpcHandle;
    pDdiTable->pfnCloseIpcHandle                         = validation_layer::zeMemCloseIpcHandle;

    dditable.pfnFreeExt                                  = pDdiTable->pfnFreeExt;
    pDdiTable->pfnFreeExt                                = validation_layer::zeMemFreeExt;

    dditable.pfnPutIpcHandle                             = pDdiTable->pfnPutIpcHandle;
    pDdiTable->pfnPutIpcHandle                           = validation_layer::zeMemPutIpcHandle;

    dditable.pfnGetPitchFor2dImage                       = pDdiTable->pfnGetPitchFor2dImage;
    pDdiTable->pfnGetPitchFor2dImage                     = validation_layer::zeMemGetPitchFor2dImage;

    return result;
}